

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::AddSymbol(std::basic_string_view<char,std::char_traits<char>>,void_const*,std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Message_const&,google::protobuf::Symbol)::__2,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  AlphaNum local_118;
  AlphaNum local_e8;
  AlphaNum local_b8;
  AlphaNum local_88;
  AlphaNum local_58;
  
  local_58.piece_ = NullSafeStringView("\"");
  local_88.piece_ =
       std::basic_string_view<char,_std::char_traits<char>_>::substr
                 (*(basic_string_view<char,_std::char_traits<char>_> **)this,
                  **(long **)(this + 8) + 1,0xffffffffffffffff);
  local_b8.piece_ = NullSafeStringView("\" is already defined in \"");
  local_e8.piece_ =
       std::basic_string_view<char,_std::char_traits<char>_>::substr
                 (*(basic_string_view<char,_std::char_traits<char>_> **)this,0,
                  **(size_type **)(this + 8));
  local_118.piece_ = NullSafeStringView("\".");
  StrCat<>(__return_storage_ptr__,&local_58,&local_88,&local_b8,&local_e8,&local_118);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}